

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBStringList::splitstr(CBStringList *this,CBStream *b,CBString *s)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = bssplitstrcb(b->m_s,&s->super_tagbstring,streamSplitCb,this);
  if (-1 < iVar1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Split bstream failure",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStringList::splitstr (const CBStream& b, const CBString& s) {
	if (0 > bssplitstrcb (b.m_s, (bstring) &s, streamSplitCb, 
	                    (void *) this)) {
		bstringThrow ("Split bstream failure");
	}
}